

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation_statistics_helper.cpp
# Opt level: O2

RelationStats *
duckdb::RelationStatisticsHelper::ExtractWindowStats
          (RelationStats *__return_storage_ptr__,LogicalWindow *window,RelationStats *child_stats)

{
  ulong uVar1;
  long lVar2;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  RelationStats::RelationStats(__return_storage_ptr__);
  __return_storage_ptr__->cardinality = child_stats->cardinality;
  ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::operator=
            ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
             __return_storage_ptr__,
             (vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)child_stats);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__return_storage_ptr__->column_names,
              &(child_stats->column_names).
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  __return_storage_ptr__->stats_initialized = true;
  (*(window->super_LogicalOperator)._vptr_LogicalOperator[2])(&local_50,window);
  lVar2 = CONCAT71(local_50._M_string_length._1_7_,(undefined1)local_50._M_string_length) -
          (long)local_50._M_dataplus._M_p;
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)
             &local_50);
  for (uVar1 = (long)(child_stats->column_distinct_count).
                     super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                     super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(child_stats->column_distinct_count).
                     super_vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>.
                     super__Vector_base<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4; uVar1 < (ulong)(lVar2 >> 4);
      uVar1 = uVar1 + 1) {
    local_50._M_dataplus._M_p = (pointer)child_stats->cardinality;
    local_50._M_string_length._0_1_ = 0;
    ::std::vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_>::
    emplace_back<duckdb::DistinctCount>
              ((vector<duckdb::DistinctCount,_std::allocator<duckdb::DistinctCount>_> *)
               __return_storage_ptr__,(DistinctCount *)&local_50);
    ::std::__cxx11::string::string((string *)&local_50,"window",&local_51);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &__return_storage_ptr__->column_names,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

RelationStats RelationStatisticsHelper::ExtractWindowStats(LogicalWindow &window, RelationStats &child_stats) {
	RelationStats stats;
	stats.cardinality = child_stats.cardinality;
	stats.column_distinct_count = child_stats.column_distinct_count;
	stats.column_names = child_stats.column_names;
	stats.stats_initialized = true;
	auto num_child_columns = window.GetColumnBindings().size();

	for (idx_t column_index = child_stats.column_distinct_count.size(); column_index < num_child_columns;
	     column_index++) {
		stats.column_distinct_count.push_back(DistinctCount({child_stats.cardinality, false}));
		stats.column_names.push_back("window");
	}
	return stats;
}